

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

BerdyOptions * __thiscall
iDynTree::BerdyHelper::getOptions(BerdyOptions *__return_storage_ptr__,BerdyHelper *this)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  __return_storage_ptr__->includeFixedBaseExternalWrench =
       (this->m_options).includeFixedBaseExternalWrench;
  bVar2 = (this->m_options).includeAllNetExternalWrenchesAsDynamicVariables;
  bVar3 = (this->m_options).includeAllJointAccelerationsAsSensors;
  bVar4 = (this->m_options).includeAllJointTorquesAsSensors;
  bVar5 = (this->m_options).includeAllNetExternalWrenchesAsSensors;
  __return_storage_ptr__->berdyVariant = (this->m_options).berdyVariant;
  __return_storage_ptr__->includeAllNetExternalWrenchesAsDynamicVariables = bVar2;
  __return_storage_ptr__->includeAllJointAccelerationsAsSensors = bVar3;
  __return_storage_ptr__->includeAllJointTorquesAsSensors = bVar4;
  __return_storage_ptr__->includeAllNetExternalWrenchesAsSensors = bVar5;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->jointOnWhichTheInternalWrenchIsMeasured,
           &(this->m_options).jointOnWhichTheInternalWrenchIsMeasured);
  (__return_storage_ptr__->baseLink)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->baseLink).field_2;
  pcVar1 = (this->m_options).baseLink._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->baseLink,pcVar1,
             pcVar1 + (this->m_options).baseLink._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

BerdyOptions BerdyHelper::getOptions() const
{
    return m_options;
}